

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,ProdItem *args)

{
  iterator pPVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *in_RDI;
  ProdItem *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pPVar1 = end(in_RDI);
    *(undefined8 *)pPVar1 = *in_RSI;
    pPVar1->target = (RandSeqProductionSymbol *)in_RSI[1];
    (pPVar1->args)._M_ptr = (pointer)in_RSI[2];
    (pPVar1->args)._M_extent._M_extent_value = in_RSI[3];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }